

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
          (MultiSampleState *this,VkSampleCountFlagBits _rasterizationSamples,
          VkBool32 _sampleShadingEnable,float _minSampleShading,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *_sampleMask,
          bool _alphaToCoverageEnable,bool _alphaToOneEnable)

{
  undefined3 in_register_00000081;
  undefined3 in_register_00000089;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_sampleMask,_sampleMask);
  (this->super_VkPipelineMultisampleStateCreateInfo).sType =
       VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  (this->super_VkPipelineMultisampleStateCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineMultisampleStateCreateInfo).flags = 0;
  (this->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples = _rasterizationSamples;
  (this->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable = _sampleShadingEnable;
  (this->super_VkPipelineMultisampleStateCreateInfo).minSampleShading = _minSampleShading;
  (this->super_VkPipelineMultisampleStateCreateInfo).pSampleMask =
       (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->super_VkPipelineMultisampleStateCreateInfo).alphaToCoverageEnable =
       CONCAT31(in_register_00000081,_alphaToCoverageEnable);
  (this->super_VkPipelineMultisampleStateCreateInfo).alphaToOneEnable =
       CONCAT31(in_register_00000089,_alphaToOneEnable);
  return;
}

Assistant:

PipelineCreateInfo::MultiSampleState::MultiSampleState (vk::VkSampleCountFlagBits				_rasterizationSamples,
														vk::VkBool32							_sampleShadingEnable,
														float									_minSampleShading,
														const std::vector<vk::VkSampleMask>&	_sampleMask,
														bool									_alphaToCoverageEnable,
														bool									_alphaToOneEnable)
	: m_sampleMask(_sampleMask)
{
	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
	pNext = DE_NULL;
	flags					= 0u;
	rasterizationSamples	= _rasterizationSamples;
	sampleShadingEnable		= _sampleShadingEnable;
	minSampleShading		= _minSampleShading;
	pSampleMask				= &m_sampleMask[0];
	alphaToCoverageEnable   = _alphaToCoverageEnable;
	alphaToOneEnable		= _alphaToOneEnable;
}